

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Subtree ts_parser__lex(TSParser *self,StackVersion version,TSStateId parse_state)

{
  Length *pLVar1;
  uint32_t uVar2;
  ulong uVar3;
  TSLanguage *language;
  _Bool has_external_tokens;
  bool bVar4;
  _Bool _Var5;
  TSSymbol symbol_00;
  uint32_t uVar6;
  uint uVar7;
  Subtree external_token_00;
  char *pcVar8;
  bool bVar9;
  Length LVar10;
  Length LVar11;
  Length LVar12;
  ulong local_288;
  uint length;
  uint32_t end_byte;
  uint32_t lookahead_bytes_1;
  Length size_1;
  Length padding_1;
  TSSymbol symbol;
  _Bool is_keyword;
  uint32_t lookahead_bytes;
  Length size;
  Length padding;
  _Bool found_token;
  uint uStack_d0;
  _Bool found_token_1;
  Length current_position;
  uint32_t local_b4;
  undefined8 uStack_b0;
  uint32_t lookahead_end_byte;
  uint32_t local_a8;
  undefined8 local_9c;
  Length error_end_position;
  uint32_t local_88;
  TSPoint local_80;
  Length error_start_position;
  int32_t first_error_character;
  _Bool skipped_error;
  _Bool error_mode;
  _Bool found_external_token;
  _Bool *valid_external_tokens;
  TSLexMode lex_mode;
  Subtree external_token;
  Length start_position;
  TSStateId parse_state_local;
  StackVersion version_local;
  TSParser *self_local;
  Subtree result;
  
  LVar10 = ts_stack_position(self->stack,version);
  external_token_00 = ts_stack_last_external_token(self->stack,version);
  valid_external_tokens._4_4_ = self->language->lex_modes[parse_state];
  _first_error_character =
       ts_language_enabled_external_tokens(self->language,(uint)valid_external_tokens._4_4_ >> 0x10)
  ;
  has_external_tokens = false;
  bVar9 = parse_state == 0;
  bVar4 = false;
  error_start_position.extent.column = 0;
  join_0x00000010_0x00000000_ = length_zero();
  error_start_position.bytes = local_88;
  local_80 = error_end_position.extent;
  _uStack_b0 = length_zero();
  local_9c = uStack_b0;
  error_end_position.bytes = local_a8;
  local_b4 = 0;
  ts_lexer_reset(&self->lexer,LVar10);
  do {
    pLVar1 = &(self->lexer).current_position;
    uVar3._0_4_ = pLVar1->bytes;
    uVar3._4_4_ = (pLVar1->extent).row;
    uVar7 = (self->lexer).current_position.extent.column;
    LVar12 = *pLVar1;
    if (_first_error_character != (_Bool *)0x0) {
      if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
         (self->dot_graph_file != (FILE *)0x0)) {
        snprintf((self->lexer).debug_buffer,0x400,"lex_external state:%d, row:%u, column:%u",
                 (ulong)valid_external_tokens._6_2_,uVar3 >> 0x20,(ulong)uVar7);
        ts_parser__log(self);
      }
      ts_lexer_start(&self->lexer);
      ts_parser__restore_external_scanner(self,external_token_00);
      _Var5 = (*(self->language->external_scanner).scan)
                        (self->external_scanner_payload,(TSLexer *)self,_first_error_character);
      ts_lexer_finish(&self->lexer,&local_b4);
      if ((_Var5) &&
         (((uint)(undefined4)uVar3 < (self->lexer).token_end_position.bytes ||
          ((!bVar9 && (_Var5 = ts_stack_has_advanced_since_error(self->stack,version), _Var5)))))) {
        has_external_tokens = true;
LAB_00139786:
        if (bVar4) {
          LVar11.extent.column = error_start_position.bytes;
          LVar11.bytes = local_80.row;
          LVar11.extent.row = local_80.column;
          LVar11 = length_sub(LVar11,LVar10);
          LVar12.extent.column = error_end_position.bytes;
          LVar12.bytes = (uint32_t)local_9c;
          LVar12.extent.row = local_9c._4_4_;
          LVar10.extent.column = error_start_position.bytes;
          LVar10.bytes = local_80.row;
          LVar10.extent.row = local_80.column;
          LVar10 = length_sub(LVar12,LVar10);
          self_local = (TSParser *)
                       ts_subtree_new_error
                                 (&self->tree_pool,error_start_position.extent.column,LVar11,LVar10,
                                  local_b4 - (uint32_t)local_9c,parse_state,self->language);
        }
        else {
          if ((self->lexer).token_end_position.bytes < (self->lexer).token_start_position.bytes) {
            uVar6 = (self->lexer).token_end_position.extent.row;
            (self->lexer).token_start_position.bytes = (self->lexer).token_end_position.bytes;
            (self->lexer).token_start_position.extent.row = uVar6;
            (self->lexer).token_start_position.extent.column =
                 (self->lexer).token_end_position.extent.column;
          }
          padding_1.extent.row._3_1_ = false;
          padding_1.extent.row._0_2_ = (self->lexer).data.result_symbol;
          LVar10 = length_sub((self->lexer).token_start_position,LVar10);
          LVar12 = length_sub((self->lexer).token_end_position,(self->lexer).token_start_position);
          uVar6 = local_b4 - (self->lexer).token_end_position.bytes;
          if (has_external_tokens == false) {
            if (((TSSymbol)padding_1.extent.row == self->language->keyword_capture_token) &&
               ((TSSymbol)padding_1.extent.row != 0)) {
              uVar2 = (self->lexer).token_end_position.bytes;
              ts_lexer_reset(&self->lexer,(self->lexer).token_start_position);
              ts_lexer_start(&self->lexer);
              _Var5 = (*self->language->keyword_lex_fn)((TSLexer *)self,0);
              if ((_Var5) &&
                 (((self->lexer).token_end_position.bytes == uVar2 &&
                  (_Var5 = ts_language_has_actions
                                     (self->language,parse_state,(self->lexer).data.result_symbol),
                  _Var5)))) {
                padding_1.extent.row._3_1_ = true;
                padding_1.extent.row._0_2_ = (self->lexer).data.result_symbol;
              }
            }
          }
          else {
            padding_1.extent.row._0_2_ =
                 (self->language->external_scanner).symbol_map[(TSSymbol)padding_1.extent.row];
          }
          self_local = (TSParser *)
                       ts_subtree_new_leaf(&self->tree_pool,(TSSymbol)padding_1.extent.row,LVar10,
                                           LVar12,uVar6,parse_state,has_external_tokens,
                                           padding_1.extent.row._3_1_,self->language);
          if (has_external_tokens != false) {
            uVar7 = (*(self->language->external_scanner).serialize)
                              (self->external_scanner_payload,(self->lexer).debug_buffer);
            ts_external_scanner_state_init
                      (&(((SubtreeHeapData *)self_local)->field_17).external_scanner_state,
                       (self->lexer).debug_buffer,uVar7);
          }
        }
        if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
           (self->dot_graph_file != (FILE *)0x0)) {
          language = self->language;
          symbol_00 = ts_subtree_symbol((Subtree)self_local);
          pcVar8 = ts_language_symbol_name(language,symbol_00);
          LVar10 = ts_subtree_total_size((Subtree)self_local);
          local_288 = LVar10._0_8_;
          snprintf((self->lexer).debug_buffer,0x400,"lexed_lookahead sym:%s, size:%u",pcVar8,
                   local_288 & 0xffffffff);
          ts_parser__log(self);
        }
        return (Subtree)(SubtreeHeapData *)self_local;
      }
      ts_lexer_reset(&self->lexer,LVar12);
    }
    if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
       (self->dot_graph_file != (FILE *)0x0)) {
      snprintf((self->lexer).debug_buffer,0x400,"lex_internal state:%d, row:%u, column:%u",
               (ulong)valid_external_tokens._4_2_,uVar3 >> 0x20,(ulong)uVar7);
      ts_parser__log(self);
    }
    ts_lexer_start(&self->lexer);
    _Var5 = (*self->language->lex_fn)((TSLexer *)self,valid_external_tokens._4_2_);
    ts_lexer_finish(&self->lexer,&local_b4);
    if (_Var5) goto LAB_00139786;
    if (bVar9) {
      if (!bVar4) {
        if (((self->lexer).logger.log != (_func_void_void_ptr_TSLogType_char_ptr *)0x0) ||
           (self->dot_graph_file != (FILE *)0x0)) {
          snprintf((self->lexer).debug_buffer,0x400,"skip_unrecognized_character");
          ts_parser__log(self);
        }
        bVar4 = true;
        local_80.row = (self->lexer).token_start_position.bytes;
        local_80.column = (self->lexer).token_start_position.extent.row;
        error_start_position.bytes = (self->lexer).token_start_position.extent.column;
        local_9c._0_4_ = (self->lexer).token_start_position.bytes;
        local_9c._4_4_ = (self->lexer).token_start_position.extent.row;
        error_end_position.bytes = (self->lexer).token_start_position.extent.column;
        error_start_position.extent.column = (self->lexer).data.lookahead;
      }
      if ((self->lexer).current_position.bytes == (uint32_t)local_9c) {
        if ((self->lexer).data.lookahead == 0) {
          (self->lexer).data.result_symbol = 0xffff;
          goto LAB_00139786;
        }
        (*(self->lexer).data.advance)((TSLexer *)self,false);
      }
      local_9c._0_4_ = (self->lexer).current_position.bytes;
      local_9c._4_4_ = (self->lexer).current_position.extent.row;
      error_end_position.bytes = (self->lexer).current_position.extent.column;
    }
    else {
      bVar9 = true;
      valid_external_tokens._4_4_ = *self->language->lex_modes;
      _first_error_character =
           ts_language_enabled_external_tokens
                     (self->language,(uint)valid_external_tokens._4_4_ >> 0x10);
      ts_lexer_reset(&self->lexer,LVar10);
    }
  } while( true );
}

Assistant:

static Subtree ts_parser__lex(TSParser *self, StackVersion version, TSStateId parse_state) {
  Length start_position = ts_stack_position(self->stack, version);
  Subtree external_token = ts_stack_last_external_token(self->stack, version);
  TSLexMode lex_mode = self->language->lex_modes[parse_state];
  const bool *valid_external_tokens = ts_language_enabled_external_tokens(
    self->language,
    lex_mode.external_lex_state
  );

  bool found_external_token = false;
  bool error_mode = parse_state == ERROR_STATE;
  bool skipped_error = false;
  int32_t first_error_character = 0;
  Length error_start_position = length_zero();
  Length error_end_position = length_zero();
  uint32_t lookahead_end_byte = 0;
  ts_lexer_reset(&self->lexer, start_position);

  for (;;) {
    Length current_position = self->lexer.current_position;

    if (valid_external_tokens) {
      LOG(
        "lex_external state:%d, row:%u, column:%u",
        lex_mode.external_lex_state,
        current_position.extent.row,
        current_position.extent.column
      );
      ts_lexer_start(&self->lexer);
      ts_parser__restore_external_scanner(self, external_token);
      bool found_token = self->language->external_scanner.scan(
        self->external_scanner_payload,
        &self->lexer.data,
        valid_external_tokens
      );
      ts_lexer_finish(&self->lexer, &lookahead_end_byte);

      // Zero-length external tokens are generally allowed, but they're not
      // allowed right after a syntax error. This is for two reasons:
      // 1. After a syntax error, the lexer is looking for any possible token,
      //    as opposed to the specific set of tokens that are valid in some
      //    parse state. In this situation, it's very easy for an external
      //    scanner to produce unwanted zero-length tokens.
      // 2. The parser sometimes inserts *missing* tokens to recover from
      //    errors. These tokens are also zero-length. If we allow more
      //    zero-length tokens to be created after missing tokens, it
      //    can lead to infinite loops. Forbidding zero-length tokens
      //    right at the point of error recovery is a conservative strategy
      //    for preventing this kind of infinite loop.
      if (found_token && (
        self->lexer.token_end_position.bytes > current_position.bytes ||
        (!error_mode && ts_stack_has_advanced_since_error(self->stack, version))
      )) {
        found_external_token = true;
        break;
      }

      ts_lexer_reset(&self->lexer, current_position);
    }

    LOG(
      "lex_internal state:%d, row:%u, column:%u",
      lex_mode.lex_state,
      current_position.extent.row,
      current_position.extent.column
    );
    ts_lexer_start(&self->lexer);
    bool found_token = self->language->lex_fn(&self->lexer.data, lex_mode.lex_state);
    ts_lexer_finish(&self->lexer, &lookahead_end_byte);
    if (found_token) break;

    if (!error_mode) {
      error_mode = true;
      lex_mode = self->language->lex_modes[ERROR_STATE];
      valid_external_tokens = ts_language_enabled_external_tokens(
        self->language,
        lex_mode.external_lex_state
      );
      ts_lexer_reset(&self->lexer, start_position);
      continue;
    }

    if (!skipped_error) {
      LOG("skip_unrecognized_character");
      skipped_error = true;
      error_start_position = self->lexer.token_start_position;
      error_end_position = self->lexer.token_start_position;
      first_error_character = self->lexer.data.lookahead;
    }

    if (self->lexer.current_position.bytes == error_end_position.bytes) {
      if (self->lexer.data.lookahead == 0) {
        self->lexer.data.result_symbol = ts_builtin_sym_error;
        break;
      }
      self->lexer.data.advance(&self->lexer.data, false);
    }

    error_end_position = self->lexer.current_position;
  }

  Subtree result;
  if (skipped_error) {
    Length padding = length_sub(error_start_position, start_position);
    Length size = length_sub(error_end_position, error_start_position);
    uint32_t lookahead_bytes = lookahead_end_byte - error_end_position.bytes;
    result = ts_subtree_new_error(
      &self->tree_pool,
      first_error_character,
      padding,
      size,
      lookahead_bytes,
      parse_state,
      self->language
    );
  } else {
    if (self->lexer.token_end_position.bytes < self->lexer.token_start_position.bytes) {
      self->lexer.token_start_position = self->lexer.token_end_position;
    }

    bool is_keyword = false;
    TSSymbol symbol = self->lexer.data.result_symbol;
    Length padding = length_sub(self->lexer.token_start_position, start_position);
    Length size = length_sub(self->lexer.token_end_position, self->lexer.token_start_position);
    uint32_t lookahead_bytes = lookahead_end_byte - self->lexer.token_end_position.bytes;

    if (found_external_token) {
      symbol = self->language->external_scanner.symbol_map[symbol];
    } else if (symbol == self->language->keyword_capture_token && symbol != 0) {
      uint32_t end_byte = self->lexer.token_end_position.bytes;
      ts_lexer_reset(&self->lexer, self->lexer.token_start_position);
      ts_lexer_start(&self->lexer);
      if (
        self->language->keyword_lex_fn(&self->lexer.data, 0) &&
        self->lexer.token_end_position.bytes == end_byte &&
        ts_language_has_actions(self->language, parse_state, self->lexer.data.result_symbol)
      ) {
        is_keyword = true;
        symbol = self->lexer.data.result_symbol;
      }
    }

    result = ts_subtree_new_leaf(
      &self->tree_pool,
      symbol,
      padding,
      size,
      lookahead_bytes,
      parse_state,
      found_external_token,
      is_keyword,
      self->language
    );

    if (found_external_token) {
      unsigned length = self->language->external_scanner.serialize(
        self->external_scanner_payload,
        self->lexer.debug_buffer
      );
      ts_external_scanner_state_init(
        &((SubtreeHeapData *)result.ptr)->external_scanner_state,
        self->lexer.debug_buffer,
        length
      );
    }
  }

  LOG(
    "lexed_lookahead sym:%s, size:%u",
    SYM_NAME(ts_subtree_symbol(result)),
    ts_subtree_total_size(result).bytes
  );
  return result;
}